

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O3

void __thiscall
array<array<int,_allocator_default<int>_>,_allocator_default<array<int,_allocator_default<int>_>_>_>
::alloc(array<array<int,_allocator_default<int>_>,_allocator_default<array<int,_allocator_default<int>_>_>_>
        *this,int new_len)

{
  uint uVar1;
  int iVar2;
  array<int,_allocator_default<int>_> *paVar3;
  long lVar4;
  
  this->list_size = new_len;
  paVar3 = allocator_default<array<int,_allocator_default<int>_>_>::alloc_array(new_len);
  uVar1 = this->list_size;
  if (this->num_elements < this->list_size) {
    uVar1 = this->num_elements;
  }
  if (0 < (int)uVar1) {
    lVar4 = 0;
    do {
      array<int,_allocator_default<int>_>::operator=
                ((array<int,_allocator_default<int>_> *)((long)&paVar3->list + lVar4),
                 (array<int,_allocator_default<int>_> *)((long)&this->list->list + lVar4));
      lVar4 = lVar4 + 0x10;
    } while ((ulong)uVar1 << 4 != lVar4);
  }
  allocator_default<array<int,_allocator_default<int>_>_>::free_array(this->list);
  iVar2 = this->list_size;
  if (this->num_elements < this->list_size) {
    iVar2 = this->num_elements;
  }
  this->num_elements = iVar2;
  this->list = paVar3;
  return;
}

Assistant:

void alloc(int new_len)
	{
		list_size = new_len;
		T *new_list = ALLOCATOR::alloc_array(list_size);

		int end = num_elements < list_size ? num_elements : list_size;
		for(int i = 0; i < end; i++)
			new_list[i] = list[i];

		ALLOCATOR::free_array(list);

		num_elements = num_elements < list_size ? num_elements : list_size;
		list = new_list;
	}